

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

DefinitionLookupResult * __thiscall
slang::ast::Compilation::tryGetDefinition(Compilation *this,string_view lookupName,Scope *scope)

{
  string_view lookupName_00;
  string_view lookupName_01;
  ConfigRule *pCVar1;
  table_element_pointer ppVar2;
  SyntaxNode *pSVar3;
  bool bVar4;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *pvVar5;
  pointer ppVar6;
  long lVar7;
  Symbol *pSVar8;
  pointer pRVar9;
  reference ppSVar10;
  reference ppSVar11;
  SourceLibrary *pSVar12;
  const_reference ppSVar13;
  ParameterValueAssignmentSyntax *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  DefinitionLookupResult *in_RDI;
  SourceLocation in_R8;
  const_iterator cVar14;
  Symbol *def;
  const_iterator __end3;
  const_iterator __begin3;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *__range3;
  SourceLibrary *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_> *__range2;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList;
  const_iterator scopeIt;
  Scope *searchScope;
  const_iterator it;
  InstanceBodySymbol *inst;
  ResolvedConfig *resolvedConfig;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffba8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  *in_stack_fffffffffffffbb0;
  Symbol *in_stack_fffffffffffffbb8;
  SourceLocation in_stack_fffffffffffffbc0;
  SourceLocation local_430;
  __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
  local_380;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *local_378;
  SourceLibrary *local_370;
  SourceLibrary **local_368;
  __normal_iterator<const_slang::SourceLibrary_*const_*,_std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>_>
  local_360;
  long local_358;
  bool local_350;
  undefined7 uStack_34f;
  ParameterValueAssignmentSyntax *local_348;
  Symbol *local_340;
  ConfigBlockSymbol *local_338;
  ConfigRule *local_330;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *local_320;
  undefined1 in_stack_fffffffffffffce8 [16];
  table_element_pointer parentConfig;
  Scope *in_stack_fffffffffffffcf8;
  Compilation *in_stack_fffffffffffffd00;
  SyntaxNode *in_stack_fffffffffffffd08;
  char_pointer in_stack_fffffffffffffd10;
  SourceLocation local_2e0;
  Symbol *local_290;
  ConfigBlockSymbol *local_288;
  ConfigRule *local_280;
  ConfigRule local_258;
  char_pointer local_1f0;
  table_element_pointer local_1e8;
  ConfigRule *rule;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList_00;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_1c0;
  ConfigRule *local_1b0;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_1a8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_1a0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  local_190;
  ConfigRule *local_178;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_170;
  iterator local_168;
  size_t local_158;
  ConfigRule *local_150;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_148;
  uint local_13c;
  value_type *local_138;
  value_type *local_130;
  uint local_124;
  group_type *local_120;
  size_t local_118;
  pow2_quadratic_prober local_110;
  size_t local_100;
  size_t local_f8;
  ConfigRule *local_f0;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  SyntaxNode *local_d0;
  long local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  local_b0;
  SyntaxNode *local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  SyntaxNode *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SyntaxNode *local_10;
  long local_8;
  
  local_258.useCell.name._M_str = (char *)0x0;
  local_258.useCell.sourceRange.startLoc = in_R8;
  local_258.useCell._48_8_ = in_RDX;
  local_258.paramOverrides = in_RCX;
  local_258.useCell.name._M_len =
       (size_t)Scope::getContainingInstance((Scope *)in_stack_fffffffffffffbb8);
  if (((InstanceBodySymbol *)local_258.useCell.name._M_len != (InstanceBodySymbol *)0x0) &&
     (((InstanceBodySymbol *)local_258.useCell.name._M_len)->parentInstance != (InstanceSymbol *)0x0
     )) {
    local_258.useCell.name._M_str =
         (char *)((InstanceBodySymbol *)local_258.useCell.name._M_len)->parentInstance->
                 resolvedConfig;
  }
  pvVar5 = (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)(in_RSI + 0x238);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::get
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             in_stack_fffffffffffffbb0);
  std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>::
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&,_slang::ast::RootSymbol_*,_true>
            ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(RootSymbol **)0x5e8884);
  rule = &local_258;
  defList_00 = pvVar5;
  local_1b0 = rule;
  local_1a8 = pvVar5;
  local_178 = rule;
  local_170 = pvVar5;
  local_150 = rule;
  local_148 = pvVar5;
  local_158 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
              ::
              hash_for<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                        (in_stack_fffffffffffffbb0,
                         (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                          *)in_stack_fffffffffffffba8);
  pCVar1 = local_150;
  local_f8 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::position_for(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
  local_f0 = pCVar1;
  local_100 = local_158;
  local_e8 = pvVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_110,local_f8);
  do {
    local_118 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_110);
    local_120 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                ::groups((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                          *)0x5e89d0);
    local_120 = local_120 + local_118;
    local_124 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
    if (local_124 != 0) {
      local_130 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                  ::elements((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                              *)0x5e8a1e);
      local_138 = local_130 + local_118 * 0xf;
      do {
        local_13c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                *)0x5e8a71);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        key_from<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>
                  ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                    *)0x5e8aa4);
        bVar4 = std::
                equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                ::operator()((equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                              *)in_stack_fffffffffffffbb0,
                             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)in_stack_fffffffffffffba8,
                             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)0x5e8abc);
        parentConfig = in_stack_fffffffffffffce8._8_8_;
        if (bVar4) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
          ::table_locator(&local_190,local_120,local_13c,local_138 + local_13c);
          goto LAB_005e8ba1;
        }
        local_124 = local_124 - 1 & local_124;
      } while (local_124 != 0);
    }
    bVar4 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
    parentConfig = in_stack_fffffffffffffce8._8_8_;
    if (bVar4) {
      memset(&local_190,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
      ::table_locator(&local_190);
      goto LAB_005e8ba1;
    }
    bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_110,*(size_t *)(in_RSI + 0x240));
    parentConfig = in_stack_fffffffffffffce8._8_8_;
  } while (bVar4);
  memset(&local_190,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  ::table_locator(&local_190);
LAB_005e8ba1:
  local_168 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              ::make_iterator((locator *)0x5e8bae);
  local_1c0.pc_ = local_168.pc_;
  local_1c0.p_ = local_168.p_;
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  ::table_iterator<false,_nullptr>(&local_1a0,&local_1c0);
  local_258.useCell.lib._M_len = (size_t)local_1a0.pc_;
  local_258.useCell.lib._M_str = (char *)local_1a0.p_;
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
         *)0x5e8c47);
  bVar4 = boost::unordered::detail::foa::operator==
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffbb0,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffba8);
  if (bVar4) {
    if ((ResolvedConfig *)local_258.useCell.name._M_str == (ResolvedConfig *)0x0) {
      memset(in_RDI,0,0x18);
      DefinitionLookupResult::DefinitionLookupResult(in_RDI);
    }
    else {
      std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::vector
                ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)0x5e8cd7);
      lookupName_00._M_str = (char *)in_stack_fffffffffffffd10;
      lookupName_00._M_len = (size_t)in_stack_fffffffffffffd08;
      resolveConfigRules(in_stack_fffffffffffffd00,lookupName_00,in_stack_fffffffffffffcf8,
                         (ResolvedConfig *)parentConfig,rule,defList_00);
      in_RDI->definition = local_290;
      in_RDI->configRoot = local_288;
      in_RDI->configRule = local_280;
      std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::~vector
                ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                 in_stack_fffffffffffffbc0);
    }
  }
  else {
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)0x5e8db1);
    if (((ppVar6->second).second & 1U) != 0) {
      local_2e0 = local_258.useCell.sourceRange.startLoc;
      do {
        lVar7 = in_RSI + 0x238;
        std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        ::
        tuple<std::basic_string_view<char,_std::char_traits<char>_>_&,_const_slang::ast::Scope_*&,_true>
                  ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(Scope **)0x5e8dfb);
        local_258.syntax.ptr = (SyntaxNode *)&stack0xfffffffffffffcf8;
        local_258._96_8_ = lVar7;
        local_d0 = local_258.syntax.ptr;
        local_c8 = lVar7;
        local_98 = local_258.syntax.ptr;
        local_90 = lVar7;
        local_70 = local_258.syntax.ptr;
        local_68 = lVar7;
        local_78 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                   ::
                   hash_for<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                             (in_stack_fffffffffffffbb0,
                              (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                               *)in_stack_fffffffffffffba8);
        pSVar3 = local_70;
        local_18 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                   ::position_for(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
        local_10 = pSVar3;
        local_20 = local_78;
        local_8 = lVar7;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_18);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                     ::groups((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                               *)0x5e8f2f);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                       ::elements((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                                   *)0x5e8f7a);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                      *)0x5e8fca);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
              ::
              key_from<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>
                        ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                          *)0x5e8ff7);
              bVar4 = std::
                      equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                      ::operator()((equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                                    *)in_stack_fffffffffffffbb0,
                                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                    *)in_stack_fffffffffffffba8,
                                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                    *)0x5e9009);
              if (bVar4) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
                ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                goto LAB_005e90eb;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
          if (bVar4) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
            ::table_locator(&local_b0);
            goto LAB_005e90eb;
          }
          bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(in_RSI + 0x240));
        } while (bVar4);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
        ::table_locator(&local_b0);
LAB_005e90eb:
        local_88 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                   ::make_iterator((locator *)0x5e90f8);
        local_e0.pc_ = local_88.pc_;
        local_e0.p_ = local_88.p_;
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
        ppVar2 = local_c0.p_;
        local_1f0 = local_c0.pc_;
        local_1e8 = local_c0.p_;
        in_stack_fffffffffffffd10 = local_c0.pc_;
        cVar14 = boost::unordered::
                 unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                 ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                        *)0x5e9191);
        parentConfig = cVar14.p_;
        bVar4 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffbb0,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffba8);
        if (bVar4) {
          local_258.useCell.lib._M_str = (char *)ppVar2;
          local_258.useCell.lib._M_len = (size_t)in_stack_fffffffffffffd10;
          break;
        }
        pSVar8 = Scope::asSymbol((Scope *)local_2e0);
        local_2e0 = (SourceLocation)Symbol::getParentScope(pSVar8);
        bVar4 = false;
        if (local_2e0 != (SourceLocation)0x0) {
          in_stack_fffffffffffffbc0 = local_2e0;
          pRVar9 = std::
                   unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ::get((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                          *)in_stack_fffffffffffffbb0);
          local_430 = (SourceLocation)0x0;
          if (pRVar9 != (pointer)0x0) {
            local_430 = (SourceLocation)&pRVar9->super_Scope;
          }
          bVar4 = in_stack_fffffffffffffbc0 != local_430;
        }
      } while (bVar4);
    }
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)0x5e9282);
    local_320 = &ppVar6->second;
    if ((ResolvedConfig *)local_258.useCell.name._M_str == (ResolvedConfig *)0x0) {
      local_358 = in_RSI + 0x448;
      local_360._M_current =
           (SourceLibrary **)
           std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
           ::begin((vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                    *)in_stack_fffffffffffffba8);
      local_368 = (SourceLibrary **)
                  std::
                  vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                  ::end((vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                         *)in_stack_fffffffffffffba8);
      while (bVar4 = __gnu_cxx::
                     operator==<const_slang::SourceLibrary_*const_*,_std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>_>
                               ((__normal_iterator<const_slang::SourceLibrary_*const_*,_std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>_>
                                 *)in_stack_fffffffffffffbb0,
                                (__normal_iterator<const_slang::SourceLibrary_*const_*,_std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>_>
                                 *)in_stack_fffffffffffffba8), ((bVar4 ^ 0xffU) & 1) != 0) {
        ppSVar10 = __gnu_cxx::
                   __normal_iterator<const_slang::SourceLibrary_*const_*,_std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>_>
                   ::operator*(&local_360);
        local_370 = *ppSVar10;
        local_378 = local_320;
        local_380._M_current =
             (Symbol **)
             std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::begin
                       ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                        in_stack_fffffffffffffba8);
        std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::end
                  ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                   in_stack_fffffffffffffba8);
        while (bVar4 = __gnu_cxx::
                       operator==<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                 ((__normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                   *)in_stack_fffffffffffffbb0,
                                  (__normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                   *)in_stack_fffffffffffffba8), ((bVar4 ^ 0xffU) & 1) != 0) {
          ppSVar11 = __gnu_cxx::
                     __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                     ::operator*(&local_380);
          pSVar8 = *ppSVar11;
          pSVar12 = Symbol::getSourceLibrary(in_stack_fffffffffffffbb8);
          if (pSVar12 == local_370) {
            DefinitionLookupResult::DefinitionLookupResult(in_RDI,pSVar8);
            return in_RDI;
          }
          __gnu_cxx::
          __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
          ::operator++(&local_380);
        }
        __gnu_cxx::
        __normal_iterator<const_slang::SourceLibrary_*const_*,_std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>_>
        ::operator++(&local_360);
      }
      bVar4 = std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::empty
                        ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                         in_stack_fffffffffffffbc0);
      if (bVar4) {
        memset(in_RDI,0,0x18);
        DefinitionLookupResult::DefinitionLookupResult(in_RDI);
      }
      else {
        ppSVar13 = std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::front
                             ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *
                              )in_stack_fffffffffffffbb0);
        DefinitionLookupResult::DefinitionLookupResult(in_RDI,*ppSVar13);
      }
    }
    else {
      local_350 = local_258.useCell.targetConfig;
      uStack_34f = local_258.useCell._49_7_;
      local_348 = local_258.paramOverrides;
      lookupName_01._M_str = (char *)in_stack_fffffffffffffd10;
      lookupName_01._M_len = (size_t)in_stack_fffffffffffffd08;
      resolveConfigRules(in_stack_fffffffffffffd00,lookupName_01,in_stack_fffffffffffffcf8,
                         (ResolvedConfig *)parentConfig,rule,defList_00);
      in_RDI->definition = local_340;
      in_RDI->configRoot = local_338;
      in_RDI->configRule = local_330;
    }
  }
  return in_RDI;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::tryGetDefinition(std::string_view lookupName,
                                                                  const Scope& scope) const {
    // Try to find a config block for this scope to help choose the right definition.
    const ResolvedConfig* resolvedConfig = nullptr;
    if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
        resolvedConfig = inst->parentInstance->resolvedConfig;

    // Always search in the root scope to start. Most definitions are global.
    auto it = definitionMap.find({lookupName, root.get()});
    if (it == definitionMap.end()) {
        // If there's a config it might be able to provide an
        // override for this cell name.
        if (resolvedConfig)
            return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, {}).first;
        return {};
    }

    // If the second flag is set it means there are nested modules
    // with this name, so we need to do full scope resolution.
    if (it->second.second) {
        auto searchScope = &scope;
        do {
            auto scopeIt = definitionMap.find({lookupName, searchScope});
            if (scopeIt != definitionMap.end()) {
                it = scopeIt;
                break;
            }

            searchScope = searchScope->asSymbol().getParentScope();
        } while (searchScope && searchScope != root.get());
    }

    auto& defList = it->second.first;
    if (resolvedConfig)
        return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, defList).first;

    // If there is a global priority list try to use that.
    for (auto lib : defaultLiblist) {
        for (auto def : defList) {
            if (def->getSourceLibrary() == lib)
                return def;
        }
    }

    // Otherwise return the first definition in the list -- it's already
    // sorted in priority order.
    return defList.empty() ? DefinitionLookupResult{} : DefinitionLookupResult{defList.front()};
}